

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

void __thiscall gutil::Properties::putValue<bool>(Properties *this,char *key,bool *value)

{
  byte *in_RDX;
  ostringstream out;
  string local_1c0 [48];
  ostringstream local_190 [208];
  string *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  Properties *in_stack_ffffffffffffff50;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,(bool)(*in_RDX & 1));
  std::__cxx11::ostringstream::str();
  putString(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void putValue(const char *key, const T &value)
    {
      std::ostringstream out;
      out << value;
      putString(key, out.str());
    }